

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

int __thiscall
pybind11::detail::argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>::
call_impl<int,int(*&)(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string),0ul,1ul,2ul,pybind11::detail::void_type>
          (argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *this,
          undefined8 *f)

{
  argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *paVar1;
  code *pcVar2;
  int iVar3;
  argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  pcVar2 = (code *)*f;
  paVar1 = this + 0x50;
  if (*(argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> **)
       (this + 0x40) == paVar1) {
    local_50 = *(undefined8 *)paVar1;
    uStack_48 = *(undefined4 *)(this + 0x58);
    uStack_44 = *(undefined4 *)(this + 0x5c);
    local_60 = (argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *)
               &local_50;
  }
  else {
    local_50 = *(undefined8 *)paVar1;
    local_60 = *(argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> **)
                (this + 0x40);
  }
  local_58 = *(undefined8 *)(this + 0x48);
  *(argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> **)(this + 0x40)
       = paVar1;
  *(undefined8 *)(this + 0x48) = 0;
  this[0x50] = (argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)0x0;
  paVar1 = this + 0x30;
  if (*(argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> **)
       (this + 0x20) == paVar1) {
    local_70 = *(undefined8 *)paVar1;
    uStack_68 = *(undefined4 *)(this + 0x38);
    uStack_64 = *(undefined4 *)(this + 0x3c);
    local_80 = (argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *)
               &local_70;
  }
  else {
    local_70 = *(undefined8 *)paVar1;
    local_80 = *(argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> **)
                (this + 0x20);
  }
  local_78 = *(undefined8 *)(this + 0x28);
  *(argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> **)(this + 0x20)
       = paVar1;
  *(undefined8 *)(this + 0x28) = 0;
  this[0x30] = (argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)0x0;
  paVar1 = this + 0x10;
  if (*(argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> **)this ==
      paVar1) {
    local_30 = *(undefined8 *)paVar1;
    uStack_28 = *(undefined4 *)(this + 0x18);
    uStack_24 = *(undefined4 *)(this + 0x1c);
    local_40 = (argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *)
               &local_30;
  }
  else {
    local_30 = *(undefined8 *)paVar1;
    local_40 = *(argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> **)
                this;
  }
  local_38 = *(undefined8 *)(this + 8);
  *(argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> **)this = paVar1
  ;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>)0x0;
  iVar3 = (*pcVar2)(&local_60,&local_80);
  if (local_40 !=
      (argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *)&local_30)
  {
    operator_delete(local_40);
  }
  if (local_80 !=
      (argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *)&local_70)
  {
    operator_delete(local_80);
  }
  if (local_60 !=
      (argument_loader<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *)&local_50)
  {
    operator_delete(local_60);
  }
  return iVar3;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) && {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }